

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedNormalizer.cpp
# Opt level: O3

bool __thiscall Shell::InterpretedNormalizer::apply(InterpretedNormalizer *this,UnitList **units)

{
  UnitList *pUVar1;
  Clause *cl;
  List<Kernel::Unit_*> **ppLVar2;
  Clause *pCVar3;
  List<Kernel::Unit_*> **ppLVar4;
  void **head;
  UnitList *pUVar5;
  bool bVar6;
  FormulaUnit *fu;
  UnitList *pUVar7;
  bool bVar8;
  FTFormulaUnitTransformer<Shell::InterpretedNormalizer::NFormulaTransformer> futransf;
  NFormulaTransformer ftransf;
  LocalFormulaUnitTransformer local_58;
  undefined ***local_48;
  undefined **local_40;
  NLiteralTransformer *local_38;
  
  local_38 = this->_litTransf;
  local_48 = &local_40;
  local_40 = &PTR_transform_00b41de0;
  local_58._rule = THEORY_NORMALIZATION;
  local_58.super_FormulaUnitTransformer._vptr_FormulaUnitTransformer =
       (_func_int **)&PTR__FormulaUnitTransformer_00b41f68;
  if (*units == (UnitList *)0x0) {
    bVar6 = false;
  }
  else {
    bVar8 = true;
    ppLVar2 = (List<Kernel::Unit_*> **)&DAT_00000008;
    bVar6 = false;
    pUVar7 = (UnitList *)0x0;
    pUVar5 = (UnitList *)0x0;
    do {
      if (bVar8) {
        ppLVar2 = units;
        pUVar5 = pUVar7;
      }
      pUVar7 = pUVar5;
      pUVar1 = *ppLVar2;
      cl = (Clause *)pUVar1->_head;
      pUVar5 = pUVar1;
      if (((cl->super_Unit).field_0x4 & 1) == 0) {
        pCVar3 = apply(this,cl);
        if (cl != pCVar3) {
          if (pCVar3 != (Clause *)0x0) goto LAB_006e6f09;
          if (pUVar1 == *units) {
            *units = (*units)->_tail;
            pUVar1->_head = (Unit *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            bVar6 = true;
            pUVar5 = (UnitList *)0x0;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pUVar1;
          }
          else {
            pUVar7->_tail = pUVar1->_tail;
            pUVar1->_head = (Unit *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            bVar6 = true;
            pUVar5 = pUVar7;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pUVar1;
          }
        }
      }
      else {
        pCVar3 = (Clause *)
                 Kernel::LocalFormulaUnitTransformer::transform(&local_58,(FormulaUnit *)cl);
        if (cl != pCVar3) {
LAB_006e6f09:
          pUVar1->_head = &pCVar3->super_Unit;
          bVar6 = true;
        }
      }
      ppLVar2 = &pUVar5->_tail;
      bVar8 = pUVar5 == (UnitList *)0x0;
      ppLVar4 = ppLVar2;
      if (bVar8) {
        ppLVar4 = units;
      }
    } while (*ppLVar4 != (List<Kernel::Unit_*> *)0x0);
  }
  return bVar6;
}

Assistant:

bool InterpretedNormalizer::apply(UnitList*& units)
{
  NFormulaTransformer ftransf(_litTransf);
  FTFormulaUnitTransformer<NFormulaTransformer> futransf(InferenceRule::THEORY_NORMALIZATION, ftransf);

  bool modified = false;

  UnitList::DelIterator uit(units);
  while(uit.hasNext()) {
    Unit* u = uit.next();
    if(u->isClause()) {
      Clause* cl = static_cast<Clause*>(u);
      Clause* cl1 = apply(cl);
      if(cl!=cl1) {
	if(cl1) {
	  uit.replace(cl1);
	}
	else {
	  uit.del();
	}
	modified = true;
      }
    }
    else {
      FormulaUnit* fu = static_cast<FormulaUnit*>(u);
      FormulaUnit* fu1 = futransf.transform(fu);
      if(fu!=fu1) {
	      uit.replace(fu1);
	      modified = true;
      }
    }
  }
  return modified;
}